

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.h
# Opt level: O1

Orphan<capnp::AnyPointer> * __thiscall
capnp::copyOutOfMembrane<capnp::AnyPointer::Reader>
          (Orphan<capnp::AnyPointer> *__return_storage_ptr__,capnp *this,Reader *from,Orphanage to,
          Own<capnp::MembranePolicy> *policy)

{
  PointerReader from_00;
  MembranePolicy *pMVar1;
  CapTableBuilder *pCVar2;
  Orphanage to_00;
  Own<capnp::MembranePolicy> local_58;
  OrphanBuilder local_48;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  pCVar2 = to.capTable;
  local_28 = *(undefined8 *)this;
  uStack_20 = *(undefined8 *)(this + 8);
  local_18 = *(undefined8 *)(this + 0x10);
  uStack_10 = *(undefined8 *)(this + 0x18);
  from_00 = *(PointerReader *)this;
  local_58.disposer = (Disposer *)(pCVar2->super_CapTableReader)._vptr_CapTableReader;
  local_58.ptr = (MembranePolicy *)pCVar2[1].super_CapTableReader._vptr_CapTableReader;
  pCVar2[1].super_CapTableReader._vptr_CapTableReader = (_func_int **)0x0;
  to_00.capTable = (CapTableBuilder *)to.arena;
  to_00.arena = (BuilderArena *)from;
  _::copyOutOfMembrane(&local_48,from_00,to_00,&local_58,false);
  pMVar1 = local_58.ptr;
  (__return_storage_ptr__->builder).segment = local_48.segment;
  (__return_storage_ptr__->builder).capTable = local_48.capTable;
  (__return_storage_ptr__->builder).location = local_48.location;
  (__return_storage_ptr__->builder).tag.content = local_48.tag.content;
  local_48.segment = (SegmentBuilder *)0x0;
  local_48.location = (word *)0x0;
  if (local_58.ptr != (MembranePolicy *)0x0) {
    local_58.ptr = (MembranePolicy *)0x0;
    (**(local_58.disposer)->_vptr_Disposer)
              (local_58.disposer,
               pMVar1->_vptr_MembranePolicy[-2] + (long)&pMVar1->_vptr_MembranePolicy);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<typename kj::Decay<Reader>::Reads> copyOutOfMembrane(
    Reader&& from, Orphanage to, kj::Own<MembranePolicy> policy) {
  return _::copyOutOfMembrane(
      _::PointerHelpers<typename kj::Decay<Reader>::Reads>::getInternalReader(from),
      to, kj::mv(policy), false);
}